

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_nco_rule.cpp
# Opt level: O2

void r8vec_linspace2(int n,double a_first,double a_last,double *a)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (n == 1) {
    *a = (a_first + a_last) * 0.5;
  }
  else {
    iVar1 = n + 1;
    uVar2 = 0;
    uVar3 = 0;
    if (0 < n) {
      uVar2 = (ulong)(uint)n;
    }
    while (uVar2 != uVar3) {
      a[uVar3] = ((double)n * a_first + (double)(int)(uVar3 + 1) * a_last) / (double)iVar1;
      n = n + -1;
      uVar3 = uVar3 + 1;
    }
  }
  return;
}

Assistant:

void r8vec_linspace2 ( int n, double a_first, double a_last, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8VEC_LINSPACE creates a vector of linearly spaced values.
//
//  Discussion:
//
//    An R8VEC is a vector of R8's.
//
//    4 points evenly spaced between 0 and 12 will yield 2, 4, 6, 8, 10.
//
//    In other words, the interval is divided into N+1 even subintervals,
//    and the endpoints of internal intervals are used as the points.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 September 2012
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, double A_FIRST, A_LAST, the first and last entries.
//
//    Output, double A[N], a vector of linearly spaced data.
//
{
  int i;

  if ( n == 1 )
  {
    a[0] = ( a_first + a_last ) / 2.0;
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      a[i] = ( double( n - i     ) * a_first 
             + double(     i + 1 ) * a_last ) 
             / double( n     + 1 );
    }
  }
  return;
}